

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::DynamicPartialIndex
          (DynamicPartialIndex *this,DynamicScalableKReach *parent,Graph *graph,distance_t k,
          uint32_t budget,bool isD2)

{
  bool isD2_local;
  uint32_t budget_local;
  distance_t k_local;
  Graph *graph_local;
  DynamicScalableKReach *parent_local;
  DynamicPartialIndex *this_local;
  
  this->parent_ = parent;
  this->graph_ = graph;
  this->k_ = k;
  this->budget_ = budget;
  this->isD2_ = isD2;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::unordered_map(&this->succ_);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::unordered_map(&this->pred_);
  this->quedeg_ = &parent->quedeg_;
  this->degree_ = &parent->degree_;
  this->queue_ = &parent->queue_;
  this->quedist_ = &parent->quedist_;
  this->updated_ = &parent->updated_;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::unordered_map(&this->succ_temp_);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::unordered_map(&this->pred_temp_);
  return;
}

Assistant:

DynamicScalableKReach::DynamicPartialIndex::DynamicPartialIndex(DynamicScalableKReach &parent, const Graph &graph,
                                                                distance_t k, uint32_t budget, bool isD2)
        : parent_(parent), graph_(graph), k_(k), budget_(budget), isD2_(isD2),
          quedeg_(parent.quedeg_), degree_(parent.degree_),
          queue_(parent.queue_), quedist_(parent.quedist_), updated_(parent.updated_) {}